

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O1

_Bool trans_csrrw(DisasContext_conflict12 *ctx,arg_csrrw *a)

{
  TCGContext_conflict11 *s;
  undefined1 extraout_AL;
  uintptr_t o_1;
  TCGTemp *pTVar1;
  TCGTemp *ts;
  TCGTemp *a2;
  TCGTemp *ts_00;
  TCGv_i32 pTVar2;
  uintptr_t o;
  TCGv_i64 a2_00;
  uintptr_t o_4;
  TCGOpcode opc;
  uintptr_t o_5;
  uintptr_t o_3;
  uintptr_t o_2;
  TCGTemp *ts_01;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  ts = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  a2 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    a2_00 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs1] == (TCGv_i64)((long)pTVar1 - (long)s)) goto LAB_00c7e508;
    a2_00 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[a->rs1]);
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,opc,(TCGArg)pTVar1,(TCGArg)a2_00);
LAB_00c7e508:
  tcg_gen_op2_riscv64(s,INDEX_op_movi_i64,(TCGArg)(s->cpu_pc + (long)s),(ctx->base).pc_next);
  tcg_gen_op2_riscv64(s,INDEX_op_movi_i64,(TCGArg)ts_00,(long)a->rs1);
  tcg_gen_op2_riscv64(s,INDEX_op_movi_i64,(TCGArg)ts,(long)a->csr);
  pTVar2 = tcg_const_i32_riscv64(s,1);
  tcg_gen_op3_riscv64(s,INDEX_op_st_i32,(TCGArg)(pTVar2 + (long)s),(TCGArg)(s->cpu_env + (long)s),
                      0xfffffffffffff48c);
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar2 + (long)s));
  local_48 = (TCGTemp *)(s->cpu_env + (long)s);
  ts_01 = (TCGTemp *)((TCGv_i64)((long)pTVar1 - (long)s) + (long)s);
  pTVar1 = (TCGTemp *)((long)s + ((long)a2 - (long)s));
  local_40 = ts_01;
  local_38 = ts;
  tcg_gen_callN_riscv64(s,helper_csrrw_riscv64,pTVar1,3,&local_48);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != (TCGv_i64)((long)a2 - (long)s))) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[a->rd]),
                        (TCGArg)a2);
  }
  tcg_gen_op2_riscv64(s,INDEX_op_movi_i64,(TCGArg)(s->cpu_pc + (long)s),ctx->pc_succ_insn);
  exit_tb(ctx);
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_temp_free_internal_riscv64(s,ts_01);
  tcg_temp_free_internal_riscv64(s,ts);
  tcg_temp_free_internal_riscv64(s,pTVar1);
  tcg_temp_free_internal_riscv64(s,ts_00);
  return (_Bool)extraout_AL;
}

Assistant:

static bool trans_csrrw(DisasContext *ctx, arg_csrrw *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv source1, csr_store, dest, rs1_pass;
    RISCV_OP_CSR_PRE;
    gen_helper_csrrw(tcg_ctx, dest, tcg_ctx->cpu_env, source1, csr_store);
    RISCV_OP_CSR_POST;
    return true;
}